

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::fetchClientList(Server *this)

{
  int iVar1;
  rep rVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  bool local_6a;
  bool local_69;
  Server *this_local;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar2;
  if (this->m_rconVersion < 4) {
    bVar3 = sv(anon_var_dwarf_55397,0x5a);
    iVar1 = sendSocket(this,bVar3);
    local_6a = false;
    if (0 < iVar1) {
      bVar3 = sv(anon_var_dwarf_553ae,0x43);
      iVar1 = sendSocket(this,bVar3);
      local_6a = 0 < iVar1;
    }
    this_local._7_1_ = local_6a;
  }
  else {
    bVar3 = sv("cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"
               ,0x5f);
    iVar1 = sendSocket(this,bVar3);
    local_69 = false;
    if (0 < iVar1) {
      bVar3 = sv("cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n",0x43);
      iVar1 = sendSocket(this,bVar3);
      local_69 = 0 < iVar1;
    }
    this_local._7_1_ = local_69;
  }
  return this_local._7_1_;
}

Assistant:

bool RenX::Server::fetchClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();
	// TODO: remove all support for rconVersion < 4
	if (m_rconVersion >= 4) {
		return sendSocket("cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"sv) > 0
			&& sendSocket("cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n"sv) > 0;
	}

	return sendSocket("cclientvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PING\xA0""ADMIN\xA0""STEAM\xA0""IP\xA0""PLAYERLOG\n"sv) > 0
		&& sendSocket("cbotvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PLAYERLOG\n"sv) > 0;
}